

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void getWTREECoeffs(wtree_object wt,int X,int Y,double *coeffs,int N)

{
  int iVar1;
  int local_34;
  int local_30;
  int t2;
  int t;
  int i;
  int ymax;
  int N_local;
  double *coeffs_local;
  int Y_local;
  int X_local;
  wtree_object wt_local;
  
  if ((X < 1) || (wt->J < X)) {
    printf("X co-ordinate must be >= 1 and <= %d",(ulong)(uint)wt->J);
    exit(-1);
  }
  t = 1;
  for (t2 = 0; t2 < X; t2 = t2 + 1) {
    t = t << 1;
  }
  if ((-1 < Y) && (Y <= (int)(t - 1U))) {
    if (X == 1) {
      local_30 = 0;
    }
    else {
      local_30 = 0;
      local_34 = 1;
      for (t2 = 0; t2 < X + -1; t2 = t2 + 1) {
        local_34 = local_34 * 2;
        local_30 = local_34 + local_30;
      }
    }
    iVar1 = wt->nodelength[Y + local_30];
    for (t2 = 0; t2 < N; t2 = t2 + 1) {
      coeffs[t2] = wt->output[iVar1 + t2];
    }
    return;
  }
  printf("Y co-ordinate must be >= 0 and <= %d",(ulong)(t - 1U));
  exit(-1);
}

Assistant:

void getWTREECoeffs(wtree_object wt, int X,int Y,double *coeffs,int N) {
	int ymax,i,t,t2;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 ||Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	if (X == 1) {
		t = 0;
	}
	else {
		t = 0;
		t2 = 1;
		for (i = 0; i < X - 1; ++i) {
			t2 *= 2;
			t += t2;
		}
	}

	t += Y;
	t2 = wt->nodelength[t];
	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[t2+i];
	}

}